

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
emplaceRealloc<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
          (SmallVectorBase<slang::ast::CoverageOptionSetter> *this,pointer pos,Scope *args,
          CoverageOptionSyntax *args_1)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_type sVar3;
  CoverageOptionSyntax *pCVar4;
  undefined8 uVar5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pCVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pCVar7 = (pointer)detail::allocArray(capacity,0x18);
  *(Scope **)((long)pCVar7 + lVar11) = args;
  *(CoverageOptionSyntax **)((long)pCVar7 + lVar11 + 8) = args_1;
  *(undefined8 *)((long)pCVar7 + lVar11 + 0x10) = 0;
  pCVar8 = this->data_;
  sVar3 = this->len;
  pCVar6 = pCVar7;
  if (pCVar8 + sVar3 == pos) {
    if (sVar3 != 0) {
      lVar10 = 0;
      do {
        *(undefined8 *)((long)&pCVar7->expr + lVar10) =
             *(undefined8 *)((long)&pCVar8->expr + lVar10);
        puVar9 = (undefined8 *)((long)&(pCVar8->scope).ptr + lVar10);
        uVar5 = puVar9[1];
        puVar1 = (undefined8 *)((long)&(pCVar7->scope).ptr + lVar10);
        *puVar1 = *puVar9;
        puVar1[1] = uVar5;
        lVar10 = lVar10 + 0x18;
      } while (sVar3 * 0x18 != lVar10);
    }
  }
  else {
    for (; pCVar8 != pos; pCVar8 = pCVar8 + 1) {
      pCVar6->expr = pCVar8->expr;
      pCVar4 = (pCVar8->syntax).ptr;
      (pCVar6->scope).ptr = (pCVar8->scope).ptr;
      (pCVar6->syntax).ptr = pCVar4;
      pCVar6 = pCVar6 + 1;
    }
    sVar3 = this->len;
    pCVar8 = this->data_;
    if (pCVar8 + sVar3 != pos) {
      puVar9 = (undefined8 *)((long)pCVar7 + lVar11 + 0x18);
      do {
        puVar9[2] = pos->expr;
        pCVar4 = (pos->syntax).ptr;
        *puVar9 = (pos->scope).ptr;
        puVar9[1] = pCVar4;
        pos = pos + 1;
        puVar9 = puVar9 + 3;
      } while (pos != pCVar8 + sVar3);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pCVar7;
  return (pointer)((long)pCVar7 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}